

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re_search.c
# Opt level: O0

int re_backsrch(void)

{
  int iVar1;
  char *local_30;
  regmatch_t local_28;
  regmatch_t lastmatch;
  int tdotline;
  int tbo;
  line *clp;
  
  _tdotline = curwp->w_dotp;
  lastmatch.rm_so = curwp->w_dotline;
  lastmatch.rm_eo = curwp->w_doto + -1;
  if (lastmatch.rm_eo < 0) {
    _tdotline = _tdotline->l_bp;
    lastmatch.rm_so = lastmatch.rm_so + -1;
    lastmatch.rm_eo = _tdotline->l_used;
  }
  while( true ) {
    if (_tdotline == curbp->b_headp) {
      return 0;
    }
    regex_match[0] = (regmatch_t)((ulong)(uint)_tdotline->l_used << 0x20);
    local_28.rm_so = -1;
    while( true ) {
      if (_tdotline->l_text == (char *)0x0) {
        local_30 = "";
      }
      else {
        local_30 = _tdotline->l_text;
      }
      iVar1 = regexec((regex_t *)&regex_buff,local_30,10,(regmatch_t *)regex_match,4);
      if (iVar1 != 0 || lastmatch.rm_eo < regex_match[0].rm_so) break;
      local_28 = regex_match[0];
      regex_match[0].rm_eo = _tdotline->l_used;
      regex_match[0].rm_so = regex_match[0].rm_so + 1;
    }
    if (local_28.rm_so != -1) break;
    _tdotline = _tdotline->l_bp;
    lastmatch.rm_so = lastmatch.rm_so + -1;
    lastmatch.rm_eo = _tdotline->l_used;
  }
  regex_match[0] = local_28;
  curwp->w_doto = local_28.rm_so;
  curwp->w_dotp = _tdotline;
  curwp->w_dotline = lastmatch.rm_so;
  curwp->w_rflag = curwp->w_rflag | 2;
  return 1;
}

Assistant:

static int
re_backsrch(void)
{
	struct line		*clp;
	int		 tbo, tdotline;
	regmatch_t	 lastmatch;

	clp = curwp->w_dotp;
	tbo = curwp->w_doto;
	tdotline = curwp->w_dotline;

	/* Start search one position to the left of dot */
	tbo = tbo - 1;
	if (tbo < 0) {
		/* must move up one line */
		clp = lback(clp);
		tdotline--;
		tbo = llength(clp);
	}

	/*
	 * Note this loop does not process the last line, but this editor
	 * always makes the last line empty so this is good.
	 */
	while (clp != (curbp->b_headp)) {
		regex_match[0].rm_so = 0;
		regex_match[0].rm_eo = llength(clp);
		lastmatch.rm_so = -1;
		/*
		 * Keep searching until we don't match any longer.  Assumes a
		 * non-match does not modify the regex_match array.  We have to
		 * do this character-by-character after the first match since
		 * POSIX regexps don't give you a way to do reverse matches.
		 */
		while (!regexec(&regex_buff, ltext(clp) ? ltext(clp) : "",
		    RE_NMATCH, regex_match, REG_STARTEND) &&
		    regex_match[0].rm_so <= tbo) {
			memcpy(&lastmatch, &regex_match[0], sizeof(regmatch_t));
			regex_match[0].rm_so++;
			regex_match[0].rm_eo = llength(clp);
		}
		if (lastmatch.rm_so == -1) {
			clp = lback(clp);
			tdotline--;
			tbo = llength(clp);
		} else {
			memcpy(&regex_match[0], &lastmatch, sizeof(regmatch_t));
			curwp->w_doto = regex_match[0].rm_so;
			curwp->w_dotp = clp;
			curwp->w_dotline = tdotline;
			curwp->w_rflag |= WFMOVE;
			return (TRUE);
		}
	}
	return (FALSE);
}